

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

bool __thiscall
sptk::Matrix::GetSubmatrix
          (Matrix *this,int row_offset,int num_row_of_submatrix,int column_offset,
          int num_column_of_submatrix,Matrix *submatrix)

{
  pointer ppdVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (num_row_of_submatrix < 1 || row_offset < 0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    if (((0 < num_column_of_submatrix) && (bVar2 = false, -1 < column_offset)) &&
       (num_row_of_submatrix + row_offset <= this->num_row_)) {
      bVar2 = false;
      if (((this != submatrix) && (submatrix != (Matrix *)0x0)) &&
         (bVar2 = false, num_column_of_submatrix + column_offset <= this->num_column_)) {
        if ((submatrix->num_row_ != num_row_of_submatrix) ||
           (submatrix->num_column_ != num_column_of_submatrix)) {
          Resize(submatrix,num_row_of_submatrix,num_column_of_submatrix);
        }
        for (uVar3 = 0; uVar3 != (uint)num_row_of_submatrix; uVar3 = uVar3 + 1) {
          ppdVar1 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          for (uVar4 = 0; (uint)num_column_of_submatrix != uVar4; uVar4 = uVar4 + 1) {
            (submatrix->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3][uVar4] =
                 ppdVar1[uVar3 + (uint)row_offset][(uint)column_offset + uVar4];
          }
        }
        bVar2 = true;
      }
    }
  }
  return bVar2;
}

Assistant:

bool Matrix::GetSubmatrix(int row_offset, int num_row_of_submatrix,
                          int column_offset, int num_column_of_submatrix,
                          Matrix* submatrix) const {
  if (row_offset < 0 || num_row_of_submatrix <= 0 ||
      num_row_ < row_offset + num_row_of_submatrix || column_offset < 0 ||
      num_column_of_submatrix <= 0 ||
      num_column_ < column_offset + num_column_of_submatrix ||
      NULL == submatrix || this == submatrix) {
    return false;
  }

  if (submatrix->num_row_ != num_row_of_submatrix ||
      submatrix->num_column_ != num_column_of_submatrix) {
    submatrix->Resize(num_row_of_submatrix, num_column_of_submatrix);
  }

  for (int i(0); i < num_row_of_submatrix; ++i) {
    for (int j(0); j < num_column_of_submatrix; ++j) {
      submatrix->index_[i][j] = index_[row_offset + i][column_offset + j];
    }
  }

  return true;
}